

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O2

iterator * __thiscall
google::
dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
::erase(iterator *__return_storage_ptr__,
       dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *this,const_iterator pos)

{
  bool bVar1;
  iterator local_30;
  
  end(&local_30,this);
  if (pos.pos == local_30.pos) {
    end(__return_storage_ptr__,this);
  }
  else {
    bVar1 = set_deleted(this,&pos);
    if (bVar1) {
      this->num_deleted = this->num_deleted + 1;
      (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
      consider_shrink_ = true;
    }
    __return_storage_ptr__->ht = this;
    __return_storage_ptr__->pos = pos.pos;
    __return_storage_ptr__->end = pos.end;
    dense_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::advance_past_empty_and_deleted(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

iterator erase(const_iterator pos) {
    if (pos == end()) return end();  // sanity check
    if (set_deleted(pos)) {    // true if object has been newly deleted
      ++num_deleted;
      settings.set_consider_shrink(
          true);  // will think about shrink after next insert
    }
    return iterator(this, const_cast<pointer>(pos.pos), const_cast<pointer>(pos.end), true);
  }